

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTable *pIVar1;
  short sVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  byte in_DL;
  byte in_SIL;
  int in_EDI;
  ImGuiTableColumn *other_column;
  int other_column_n_1;
  ImGuiTableColumn *column;
  int other_column_n;
  ImGuiTableColumnIdx sort_order_max;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTableColumn *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  short in_stack_ffffffffffffffc6;
  int local_2c;
  int local_20;
  short local_1a;
  byte local_6;
  
  local_6 = in_DL & 1;
  pIVar1 = GImGui->CurrentTable;
  if ((pIVar1->Flags & 0x4000000U) == 0) {
    local_6 = 0;
  }
  local_1a = 0;
  if (local_6 != 0) {
    for (local_20 = 0; local_20 < pIVar1->ColumnsCount; local_20 = local_20 + 1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,local_20);
      sVar2 = ImMax<short>(local_1a,pIVar3->SortOrder);
      in_stack_ffffffffffffffc6 = local_1a;
      local_1a = sVar2;
    }
  }
  pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,in_EDI);
  pIVar3->field_0x6d = pIVar3->field_0x6d & 0xfc | in_SIL & 3;
  if ((pIVar3->field_0x6d & 3) == 0) {
    pIVar3->SortOrder = -1;
  }
  else if ((pIVar3->SortOrder == -1) || (local_6 == 0)) {
    if (local_6 == 0) {
      in_stack_ffffffffffffffc0 = 0;
    }
    else {
      in_stack_ffffffffffffffc0 = local_1a + 1;
    }
    pIVar3->SortOrder = (ImGuiTableColumnIdx)in_stack_ffffffffffffffc0;
  }
  for (local_2c = 0; local_2c < pIVar1->ColumnsCount; local_2c = local_2c + 1) {
    pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,local_2c);
    if ((pIVar4 != pIVar3) && (local_6 == 0)) {
      pIVar4->SortOrder = -1;
    }
    TableFixColumnSortDirection
              ((ImGuiTable *)
               CONCAT26(in_stack_ffffffffffffffc6,
                        CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffb8);
  }
  pIVar1->IsSettingsDirty = true;
  pIVar1->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}